

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmbuffer.c
# Opt level: O3

void p_shm_buffer_clear(PShmBuffer *buf)

{
  pboolean pVar1;
  ppointer __s;
  psize __n;
  char *pcVar2;
  
  if (buf == (PShmBuffer *)0x0) {
    return;
  }
  __s = p_shm_get_address(buf->shm);
  if (__s == (ppointer)0x0) {
    pcVar2 = "PShmBuffer::p_shm_buffer_clear: p_shm_get_address() failed";
  }
  else {
    __n = p_shm_get_size(buf->shm);
    pVar1 = p_shm_lock(buf->shm,(PError **)0x0);
    if (pVar1 == 0) {
      pcVar2 = "PShmBuffer::p_shm_buffer_clear: p_shm_lock() failed";
    }
    else {
      memset(__s,0,__n);
      pVar1 = p_shm_unlock(buf->shm,(PError **)0x0);
      if (pVar1 != 0) {
        return;
      }
      pcVar2 = "PShmBuffer::p_shm_buffer_clear: p_shm_unlock() failed";
    }
  }
  printf("** Error: %s **\n",pcVar2);
  return;
}

Assistant:

P_LIB_API void
p_shm_buffer_clear (PShmBuffer *buf)
{
	ppointer	addr;
	psize		size;

	if (P_UNLIKELY (buf == NULL))
		return;

	if (P_UNLIKELY ((addr = p_shm_get_address (buf->shm)) == NULL)) {
		P_ERROR ("PShmBuffer::p_shm_buffer_clear: p_shm_get_address() failed");
		return;
	}

	size = p_shm_get_size (buf->shm);

	if (P_UNLIKELY (p_shm_lock (buf->shm, NULL) == FALSE)) {
		P_ERROR ("PShmBuffer::p_shm_buffer_clear: p_shm_lock() failed");
		return;
	}

	memset (addr, 0, size);

	if (P_UNLIKELY (p_shm_unlock (buf->shm, NULL) == FALSE))
		P_ERROR ("PShmBuffer::p_shm_buffer_clear: p_shm_unlock() failed");
}